

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleTypeHandler<6UL>::CanStorePropertyValueDirectly
          (SimpleTypeHandler<6UL> *this,DynamicObject *instance,PropertyId propertyId,
          bool allowLetConst)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  uint uVar5;
  
  if ((int)CONCAT71(in_register_00000009,allowLetConst) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x4b8,"(!allowLetConst)","!allowLetConst");
    if (!bVar2) goto LAB_00e43058;
    *puVar3 = 0;
  }
  if (0 < this->propertyCount) {
    uVar4 = 1;
    do {
      if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)((uVar4 - 1 & 0xffff) << 4)
                            ) + 8) == propertyId) {
        return true;
      }
      uVar5 = uVar4 & 0xffff;
      uVar4 = uVar4 + 1;
    } while (uVar5 < (uint)this->propertyCount);
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                              ,0x4c0,"(false)",
                              "Asking about a property this type handler doesn\'t know about?");
  if (bVar2) {
    *puVar3 = 0;
    return false;
  }
LAB_00e43058:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool SimpleTypeHandler<size>::CanStorePropertyValueDirectly(const DynamicObject* instance, PropertyId propertyId, bool allowLetConst)
    {
        Assert(!allowLetConst);
        PropertyIndex index;
        if (GetDescriptor(propertyId, &index))
        {
            return true;
        }
        else
        {
            AssertMsg(false, "Asking about a property this type handler doesn't know about?");
            return false;
        }
    }